

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerlinNoise.cpp
# Opt level: O0

double __thiscall PerlinNoise::noise(PerlinNoise *this,double x,double y,double z)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  reference pvVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double t;
  double t_00;
  double t_01;
  double dVar12;
  double res;
  int BB;
  int BA;
  int B;
  int AB;
  int AA;
  int A;
  double w;
  double v;
  double u;
  int Z;
  int Y;
  int X;
  double z_local;
  double y_local;
  double x_local;
  PerlinNoise *this_local;
  
  dVar7 = floor(x);
  dVar8 = floor(y);
  dVar9 = floor(z);
  uVar3 = (int)dVar9 & 0xff;
  dVar9 = floor(x);
  dVar9 = x - dVar9;
  dVar10 = floor(y);
  dVar10 = y - dVar10;
  dVar11 = floor(z);
  dVar11 = z - dVar11;
  t = fade(this,dVar9);
  t_00 = fade(this,dVar10);
  t_01 = fade(this,dVar11);
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&this->p,(long)(int)((int)dVar7 & 0xffU));
  iVar4 = *pvVar6 + ((int)dVar8 & 0xffU);
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->p,(long)iVar4);
  iVar1 = *pvVar6;
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->p,(long)(iVar4 + 1));
  iVar4 = *pvVar6;
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&this->p,(long)(int)(((int)dVar7 & 0xffU) + 1));
  iVar5 = *pvVar6 + ((int)dVar8 & 0xffU);
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->p,(long)iVar5);
  iVar2 = *pvVar6;
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->p,(long)(iVar5 + 1));
  iVar5 = *pvVar6;
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->p,(long)(int)(iVar1 + uVar3));
  dVar7 = grad(this,*pvVar6,dVar9,dVar10,dVar11);
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->p,(long)(int)(iVar2 + uVar3));
  dVar8 = grad(this,*pvVar6,dVar9 - 1.0,dVar10,dVar11);
  dVar7 = lerp(this,t,dVar7,dVar8);
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->p,(long)(int)(iVar4 + uVar3));
  dVar8 = grad(this,*pvVar6,dVar9,dVar10 - 1.0,dVar11);
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->p,(long)(int)(iVar5 + uVar3));
  dVar12 = grad(this,*pvVar6,dVar9 - 1.0,dVar10 - 1.0,dVar11);
  dVar8 = lerp(this,t,dVar8,dVar12);
  dVar7 = lerp(this,t_00,dVar7,dVar8);
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&this->p,(long)(int)(iVar1 + uVar3 + 1));
  dVar8 = grad(this,*pvVar6,dVar9,dVar10,dVar11 - 1.0);
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&this->p,(long)(int)(iVar2 + uVar3 + 1));
  dVar12 = grad(this,*pvVar6,dVar9 - 1.0,dVar10,dVar11 - 1.0);
  dVar8 = lerp(this,t,dVar8,dVar12);
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&this->p,(long)(int)(iVar4 + uVar3 + 1));
  dVar12 = grad(this,*pvVar6,dVar9,dVar10 - 1.0,dVar11 - 1.0);
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&this->p,(long)(int)(iVar5 + uVar3 + 1));
  dVar9 = grad(this,*pvVar6,dVar9 - 1.0,dVar10 - 1.0,dVar11 - 1.0);
  dVar9 = lerp(this,t,dVar12,dVar9);
  dVar8 = lerp(this,t_00,dVar8,dVar9);
  dVar7 = lerp(this,t_01,dVar7,dVar8);
  return (dVar7 + 1.0) / 2.0;
}

Assistant:

double PerlinNoise::noise(double x, double y, double z) {
    // Find the unit cube that contains the point
    int X = (int) floor(x) & 255;
    int Y = (int) floor(y) & 255;
    int Z = (int) floor(z) & 255;

    // Find relative x, y,z of point in cube
    x -= floor(x);
    y -= floor(y);
    z -= floor(z);

    // Compute fade curves for each of x, y, z
    double u = fade(x);
    double v = fade(y);
    double w = fade(z);

    // Hash coordinates of the 8 cube corners
    int A = p[X] + Y;
    int AA = p[A] + Z;
    int AB = p[A + 1] + Z;
    int B = p[X + 1] + Y;
    int BA = p[B] + Z;
    int BB = p[B + 1] + Z;

    // Add blended results from 8 corners of cube
    double res = 
        lerp(w,
            lerp(v,
                lerp(u,
                    grad(p[AA], x, y, z),
                    grad(p[BA], x-1, y, z)),
                lerp(u,
                    grad(p[AB], x, y-1, z),
                    grad(p[BB], x-1, y-1, z))),
            lerp(v,
                lerp(u,
                    grad(p[AA+1],x, y, z-1),
                    grad(p[BA+1], x-1, y, z-1)),
                lerp(u, grad(p[AB+1], x, y-1, z-1),
                    grad(p[BB+1], x-1, y-1, z-1))));

    return (res + 1.0) / 2.0;
}